

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<capnp::Schema>::setCapacity(Vector<capnp::Schema> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<capnp::Schema> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<capnp::Schema> newBuilder;
  size_t newSize_local;
  Vector<capnp::Schema> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<capnp::Schema>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<capnp::Schema>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<capnp::Schema>
            ((ArrayBuilder<capnp::Schema> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<capnp::Schema>>(&this->builder);
  ArrayBuilder<capnp::Schema>::addAll<kj::ArrayBuilder<capnp::Schema>>
            ((ArrayBuilder<capnp::Schema> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<capnp::Schema>>((ArrayBuilder<capnp::Schema> *)local_38);
  ArrayBuilder<capnp::Schema>::operator=(&this->builder,pAVar2);
  ArrayBuilder<capnp::Schema>::~ArrayBuilder((ArrayBuilder<capnp::Schema> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }